

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_reader.h
# Opt level: O3

void stl_reader::stl_reader_impl::
     RemoveDoubles<std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<unsigned_int,std::allocator<unsigned_int>>>
               (vector<double,_std::allocator<double>_> *uniqueCoordsOut,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *trisInOut,
               vector<double,_std::allocator<double>_> *normalsInOut,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *solidsInOut,
               vector<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>_>_>
               *coordsWithIndexInOut)

{
  pointer pCVar1;
  pointer pdVar2;
  pointer puVar3;
  ulong uVar4;
  pointer pCVar5;
  long lVar6;
  pointer puVar7;
  int iVar8;
  pointer puVar9;
  uint uVar10;
  pointer pCVar11;
  double *pdVar12;
  size_type __new_size;
  uint uVar13;
  ulong uVar14;
  index_t j;
  uint uVar15;
  index_t ni [3];
  index_t newTriInd;
  vector<unsigned_int,_std::allocator<unsigned_int>_> newIndex;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_78;
  uint local_60 [4];
  vector<double,_std::allocator<double>_> *local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  pCVar5 = (coordsWithIndexInOut->
           super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pCVar1 = (coordsWithIndexInOut->
           super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pCVar11 = pCVar5;
  local_50 = normalsInOut;
  if (pCVar5 != pCVar1) {
    uVar4 = (long)pCVar1 - (long)pCVar5 >> 5;
    lVar6 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<stl_reader::stl_reader_impl::CoordWithIndex<double,unsigned_int>*,std::vector<stl_reader::stl_reader_impl::CoordWithIndex<double,unsigned_int>,std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<double,unsigned_int>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (pCVar5,pCVar1,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<stl_reader::stl_reader_impl::CoordWithIndex<double,unsigned_int>*,std::vector<stl_reader::stl_reader_impl::CoordWithIndex<double,unsigned_int>,std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<double,unsigned_int>>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pCVar5,pCVar1);
    pCVar5 = (coordsWithIndexInOut->
             super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    pCVar11 = (coordsWithIndexInOut->
              super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
  }
  uVar4 = (long)pCVar5 - (long)pCVar11 >> 5;
  __new_size = 3;
  if (1 < uVar4) {
    lVar6 = uVar4 - 1;
    pdVar12 = pCVar11[1].data + 2;
    iVar8 = 1;
    do {
      uVar10 = 1;
      if ((pdVar12[-6] == ((CoordWithIndex<double,_unsigned_int> *)(pdVar12 + -2))->data[0]) &&
         (!NAN(pdVar12[-6]) &&
          !NAN(((CoordWithIndex<double,_unsigned_int> *)(pdVar12 + -2))->data[0]))) {
        uVar10 = 1;
        if ((pdVar12[-5] == pdVar12[-1]) && (!NAN(pdVar12[-5]) && !NAN(pdVar12[-1]))) {
          uVar10 = -(uint)(*pdVar12 != pdVar12[-4]) & 1;
        }
      }
      iVar8 = iVar8 + uVar10;
      pdVar12 = pdVar12 + 4;
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
    __new_size = (size_type)(uint)(iVar8 * 3);
  }
  std::vector<double,_std::allocator<double>_>::resize(uniqueCoordsOut,__new_size);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_48,
             (long)(coordsWithIndexInOut->
                   super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(coordsWithIndexInOut->
                   super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)&local_78);
  local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pCVar1 = (coordsWithIndexInOut->
           super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start[pCVar1->index] = 0;
  pdVar2 = (uniqueCoordsOut->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar6 = 0;
  do {
    pdVar2[lVar6] = pCVar1->data[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  uVar4 = (long)(coordsWithIndexInOut->
                super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar1 >> 5;
  if (1 < uVar4) {
    pdVar2 = (uniqueCoordsOut->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar10 = 0;
    uVar14 = 1;
    pCVar5 = pCVar1;
    do {
      pCVar5 = pCVar5 + 1;
      uVar15 = pCVar1[uVar14].index;
      if ((pCVar1[uVar14 - 1].data[0] != pCVar1[uVar14].data[0]) ||
         (NAN(pCVar1[uVar14 - 1].data[0]) || NAN(pCVar1[uVar14].data[0]))) {
LAB_0011ea98:
        uVar10 = uVar10 + 1;
        lVar6 = 0;
        do {
          pdVar2[uVar10 * 3 + (int)lVar6] = pCVar5->data[lVar6];
          lVar6 = lVar6 + 1;
        } while (lVar6 != 3);
      }
      else {
        if ((pCVar1[uVar14 - 1].data[1] != pCVar1[uVar14].data[1]) ||
           (NAN(pCVar1[uVar14 - 1].data[1]) || NAN(pCVar1[uVar14].data[1]))) goto LAB_0011ea98;
        if ((pCVar1[uVar14 - 1].data[2] != pCVar1[uVar14].data[2]) ||
           (NAN(pCVar1[uVar14 - 1].data[2]) || NAN(pCVar1[uVar14].data[2]))) goto LAB_0011ea98;
      }
      local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar15] = uVar10;
      uVar14 = uVar14 + 1;
    } while (uVar14 != uVar4);
  }
  puVar9 = (trisInOut->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((trisInOut->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish == puVar9) {
    uVar4 = 0;
    uVar10 = 0;
  }
  else {
    uVar15 = 0;
    uVar10 = 0;
    puVar7 = local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      local_60[3] = uVar10 / 3;
      puVar3 = (solidsInOut->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
               _M_impl.super__Vector_impl_data._M_start;
      if (((ulong)((long)local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start) <
           (ulong)((long)(solidsInOut->
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                         super__Vector_impl_data._M_finish - (long)puVar3)) &&
         (*(uint *)((long)puVar3 +
                   ((long)local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start)) <= uVar15 / 3)) {
        if (local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_78,
                     (iterator)
                     local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish,local_60 + 3);
          puVar9 = (trisInOut->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          puVar7 = local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
        }
        else {
          *local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish = local_60[3];
          local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
      lVar6 = 0;
      do {
        local_60[lVar6] = puVar7[puVar9[uVar15 + (int)lVar6]];
        lVar6 = lVar6 + 1;
      } while (lVar6 != 3);
      if ((local_60[0] != local_60[1]) && (local_60[1] != local_60[2] && local_60[0] != local_60[2])
         ) {
        pdVar2 = (local_50->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        lVar6 = 0;
        do {
          uVar13 = (int)lVar6 + uVar10;
          puVar9[uVar13] = local_60[lVar6];
          pdVar2[uVar13] = pdVar2[uVar15 + (int)lVar6];
          lVar6 = lVar6 + 1;
        } while (lVar6 != 3);
        uVar10 = uVar10 + 3;
      }
      uVar15 = uVar15 + 3;
      uVar4 = (long)(trisInOut->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar9 >> 2;
    } while (uVar15 < uVar4);
  }
  uVar14 = (ulong)uVar10;
  if (uVar14 < uVar4) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(trisInOut,uVar14);
    std::vector<double,_std::allocator<double>_>::resize(local_50,uVar14);
  }
  if (local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_60[0] = uVar10 / 3;
    if (local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (&local_78,
                 (iterator)
                 local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish,local_60);
    }
    else {
      *local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish = local_60[0];
      local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
  }
  puVar9 = (solidsInOut->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar7 = (solidsInOut->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  puVar3 = (solidsInOut->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (solidsInOut->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start =
       local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  (solidsInOut->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish =
       local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (solidsInOut->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = puVar9;
  local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar7;
  local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = puVar3;
  if (puVar9 != (pointer)0x0) {
    operator_delete(puVar9,(long)puVar3 - (long)puVar9);
  }
  if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void RemoveDoubles (TNumberContainer1& uniqueCoordsOut,
                      TIndexContainer1& trisInOut,
                      TNumberContainer2& normalsInOut,
                      TIndexContainer2& solidsInOut,
                      std::vector <CoordWithIndex<
                        typename TNumberContainer1::value_type,
                        typename TIndexContainer1::value_type> >
                        &coordsWithIndexInOut)
  {
    using namespace std;

    typedef typename TNumberContainer1::value_type number_t;
    typedef typename TIndexContainer1::value_type  index_t;

    sort (coordsWithIndexInOut.begin(), coordsWithIndexInOut.end());
  
  //  first count unique indices
    index_t numUnique = 1;
    for(size_t i = 1; i < coordsWithIndexInOut.size(); ++i){
      if(coordsWithIndexInOut[i] != coordsWithIndexInOut[i - 1])
        ++numUnique;
    }

    uniqueCoordsOut.resize (numUnique * 3);
    vector<index_t> newIndex (coordsWithIndexInOut.size());

    TIndexContainer2 newSolids;

  //  copy unique coordinates to 'uniqueCoordsOut' and create an index-map
  //  'newIndex', which allows to re-index triangles later on.
    index_t curInd = 0;
    newIndex[coordsWithIndexInOut[0].index] = 0;
    for(index_t i = 0; i < 3; ++i)
      uniqueCoordsOut[i] = coordsWithIndexInOut[0][i];

    for(size_t i = 1; i < coordsWithIndexInOut.size(); ++i){
      const CoordWithIndex <number_t, index_t> c = coordsWithIndexInOut[i];
      if(c != coordsWithIndexInOut[i - 1]){
        ++curInd;
        for(index_t j = 0; j < 3; ++j)
          uniqueCoordsOut[curInd * 3 + j] = coordsWithIndexInOut[i][j];
      }

      newIndex[c.index] = static_cast<index_t> (curInd);
    }

  //  re-index triangles, so that they refer to 'uniqueCoordsOut'
  //  make sure to only add triangles which refer to three different indices
    index_t numUniqueTriInds = 0;
    for(index_t i = 0; i < trisInOut.size(); i+=3){
      
      const index_t triInd = i / 3;
      const index_t newTriInd = numUniqueTriInds / 3;
      if (newSolids.size () < solidsInOut.size () &&
          solidsInOut [newSolids.size ()] <= triInd)
      {
        newSolids.push_back (newTriInd);
      }

      index_t ni[3];
      for(index_t j = 0; j < 3; ++j)
        ni[j] = newIndex[trisInOut[i+j]];

      if((ni[0] != ni[1]) && (ni[0] != ni[2]) && (ni[1] != ni[2])){
        for(index_t j = 0; j < 3; ++j)
        {
          trisInOut[numUniqueTriInds + j] = ni[j];
          normalsInOut[numUniqueTriInds + j] = normalsInOut [i + j];
        }
        numUniqueTriInds += 3;
      }
    }

    if(numUniqueTriInds < trisInOut.size())
    {
      trisInOut.resize (numUniqueTriInds);
      normalsInOut.resize (numUniqueTriInds);
    }

    if (!newSolids.empty ())
      newSolids.push_back (numUniqueTriInds / 3);
    
    using std::swap;
    swap (solidsInOut, newSolids);
  }